

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_sse2.c
# Opt level: O3

void aom_quantize_b_sse2(tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,
                        int16_t *round_ptr,int16_t *quant_ptr,int16_t *quant_shift_ptr,
                        tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,
                        uint16_t *eob_ptr,int16_t *scan_ptr,int16_t *iscan_ptr)

{
  short *psVar1;
  tran_low_t *ptVar2;
  short *psVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  long lVar8;
  undefined1 auVar9 [16];
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar10 [16];
  short sVar15;
  ushort uVar16;
  short sVar21;
  ushort uVar22;
  short sVar23;
  ushort uVar24;
  short sVar25;
  ushort uVar26;
  short sVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  undefined1 auVar20 [16];
  ushort uVar31;
  undefined1 auVar32 [16];
  short sVar33;
  undefined1 auVar37 [12];
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar50;
  __m128i coeff_vals_lo;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar48;
  short sVar49;
  short sVar51;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ushort uVar56;
  ushort uVar57;
  undefined1 auVar58 [12];
  ushort uVar67;
  ushort uVar68;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  short sVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar78;
  ushort uVar79;
  short sVar80;
  ushort uVar81;
  ushort uVar82;
  undefined1 auVar59 [16];
  short sVar77;
  short sVar83;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ushort uVar84;
  ushort uVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar95 [16];
  undefined1 auVar101 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [16];
  undefined1 auVar125 [16];
  undefined6 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [12];
  undefined6 uVar34;
  undefined8 uVar35;
  undefined1 auVar36 [12];
  undefined1 auVar43 [16];
  undefined1 auVar65 [16];
  short sVar66;
  short sVar69;
  undefined1 auVar96 [16];
  undefined1 auVar102 [16];
  undefined1 auVar97 [16];
  undefined1 auVar103 [16];
  undefined1 auVar92 [16];
  undefined1 auVar98 [16];
  undefined1 auVar104 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar99 [16];
  undefined1 auVar105 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar100 [16];
  undefined1 auVar106 [16];
  undefined1 auVar120 [16];
  undefined1 auVar126 [16];
  undefined1 auVar121 [16];
  undefined1 auVar127 [16];
  undefined1 auVar112 [16];
  undefined1 auVar116 [16];
  undefined1 auVar122 [16];
  undefined1 auVar128 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar123 [16];
  undefined1 auVar129 [16];
  undefined1 auVar114 [16];
  undefined1 auVar118 [16];
  undefined1 auVar124 [16];
  undefined1 auVar130 [16];
  
  auVar20 = *(undefined1 (*) [16])round_ptr;
  auVar61 = *(undefined1 (*) [16])quant_ptr;
  sVar11 = zbin_ptr[4] + -1;
  sVar12 = zbin_ptr[5] + -1;
  uVar17 = CONCAT24(sVar12,CONCAT22(sVar11,zbin_ptr[3] + -1));
  sVar13 = zbin_ptr[6] + -1;
  sVar14 = zbin_ptr[7] + -1;
  sVar33 = *dequant_ptr;
  sVar44 = dequant_ptr[1];
  sVar45 = dequant_ptr[2];
  sVar46 = dequant_ptr[3];
  sVar4 = dequant_ptr[4];
  sVar5 = dequant_ptr[5];
  sVar6 = dequant_ptr[6];
  sVar7 = dequant_ptr[7];
  auVar108 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar59 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar86 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc));
  sVar48 = auVar59._0_2_;
  sVar15 = -sVar48;
  sVar49 = auVar59._2_2_;
  sVar21 = -sVar49;
  sVar50 = auVar59._4_2_;
  sVar23 = -sVar50;
  sVar51 = auVar59._6_2_;
  sVar25 = -sVar51;
  sVar74 = auVar59._8_2_;
  sVar27 = -sVar74;
  sVar77 = auVar59._10_2_;
  sVar47 = -sVar77;
  sVar80 = auVar59._12_2_;
  sVar66 = -sVar80;
  sVar83 = auVar59._14_2_;
  sVar69 = -sVar83;
  auVar110._0_2_ = (ushort)(sVar15 < sVar48) * sVar48 | (ushort)(sVar15 >= sVar48) * sVar15;
  auVar110._2_2_ = (ushort)(sVar21 < sVar49) * sVar49 | (ushort)(sVar21 >= sVar49) * sVar21;
  auVar110._4_2_ = (ushort)(sVar23 < sVar50) * sVar50 | (ushort)(sVar23 >= sVar50) * sVar23;
  auVar110._6_2_ = (ushort)(sVar25 < sVar51) * sVar51 | (ushort)(sVar25 >= sVar51) * sVar25;
  auVar110._8_2_ = (ushort)(sVar27 < sVar74) * sVar74 | (ushort)(sVar27 >= sVar74) * sVar27;
  auVar110._10_2_ = (ushort)(sVar47 < sVar77) * sVar77 | (ushort)(sVar47 >= sVar77) * sVar47;
  auVar110._12_2_ = (ushort)(sVar66 < sVar80) * sVar80 | (ushort)(sVar66 >= sVar80) * sVar66;
  auVar110._14_2_ = (ushort)(sVar69 < sVar83) * sVar83 | (ushort)(sVar69 >= sVar83) * sVar69;
  auVar60 = psraw(auVar59,0xf);
  sVar48 = auVar86._0_2_;
  sVar15 = -sVar48;
  sVar49 = auVar86._2_2_;
  sVar21 = -sVar49;
  sVar50 = auVar86._4_2_;
  sVar23 = -sVar50;
  sVar51 = auVar86._6_2_;
  sVar25 = -sVar51;
  sVar74 = auVar86._8_2_;
  sVar27 = -sVar74;
  sVar77 = auVar86._10_2_;
  sVar47 = -sVar77;
  sVar80 = auVar86._12_2_;
  sVar66 = -sVar80;
  sVar83 = auVar86._14_2_;
  sVar69 = -sVar83;
  auVar107._0_2_ = (ushort)(sVar15 < sVar48) * sVar48 | (ushort)(sVar15 >= sVar48) * sVar15;
  auVar107._2_2_ = (ushort)(sVar21 < sVar49) * sVar49 | (ushort)(sVar21 >= sVar49) * sVar21;
  auVar107._4_2_ = (ushort)(sVar23 < sVar50) * sVar50 | (ushort)(sVar23 >= sVar50) * sVar23;
  auVar107._6_2_ = (ushort)(sVar25 < sVar51) * sVar51 | (ushort)(sVar25 >= sVar51) * sVar25;
  auVar107._8_2_ = (ushort)(sVar27 < sVar74) * sVar74 | (ushort)(sVar27 >= sVar74) * sVar27;
  auVar107._10_2_ = (ushort)(sVar47 < sVar77) * sVar77 | (ushort)(sVar47 >= sVar77) * sVar47;
  auVar107._12_2_ = (ushort)(sVar66 < sVar80) * sVar80 | (ushort)(sVar66 >= sVar80) * sVar66;
  auVar107._14_2_ = (ushort)(sVar69 < sVar83) * sVar83 | (ushort)(sVar69 >= sVar83) * sVar69;
  auVar87 = psraw(auVar86,0xf);
  uVar16 = (ushort)((short)(*zbin_ptr + -1) < (short)auVar110._0_2_);
  auVar52._0_2_ = -uVar16;
  uVar22 = (ushort)((short)(zbin_ptr[1] + -1) < (short)auVar110._2_2_);
  auVar52._2_2_ = -uVar22;
  uVar24 = (ushort)((short)(zbin_ptr[2] + -1) < (short)auVar110._4_2_);
  auVar52._4_2_ = -uVar24;
  uVar26 = (ushort)((short)(zbin_ptr[3] + -1) < (short)auVar110._6_2_);
  auVar52._6_2_ = -uVar26;
  auVar52._8_2_ = -(ushort)(sVar11 < (short)auVar110._8_2_);
  auVar52._10_2_ = -(ushort)(sVar12 < (short)auVar110._10_2_);
  auVar52._12_2_ = -(ushort)(sVar13 < (short)auVar110._12_2_);
  auVar52._14_2_ = -(ushort)(sVar14 < (short)auVar110._14_2_);
  auVar59._8_4_ = (undefined4)((uint6)uVar17 >> 0x10);
  auVar59._12_4_ = (undefined4)(CONCAT28(sVar14,CONCAT26(sVar13,uVar17)) >> 0x30);
  auVar59._4_4_ = auVar59._12_4_;
  auVar59._0_4_ = auVar59._8_4_;
  auVar54._0_2_ = -(ushort)(sVar11 < (short)auVar107._0_2_);
  auVar54._2_2_ = -(ushort)(sVar12 < (short)auVar107._2_2_);
  auVar54._4_2_ = -(ushort)(sVar13 < (short)auVar107._4_2_);
  auVar54._6_2_ = -(ushort)(sVar14 < (short)auVar107._6_2_);
  auVar54._8_2_ = -(ushort)(sVar11 < (short)auVar107._8_2_);
  auVar54._10_2_ = -(ushort)(sVar12 < (short)auVar107._10_2_);
  auVar54._12_2_ = -(ushort)(sVar13 < (short)auVar107._12_2_);
  auVar54._14_2_ = -(ushort)(sVar14 < (short)auVar107._14_2_);
  auVar86 = paddsw(auVar110,auVar20);
  auVar38 = pmulhw(auVar86,auVar61);
  auVar39._0_2_ = auVar38._0_2_ + auVar86._0_2_;
  auVar39._2_2_ = auVar38._2_2_ + auVar86._2_2_;
  auVar39._4_2_ = auVar38._4_2_ + auVar86._4_2_;
  auVar39._6_2_ = auVar38._6_2_ + auVar86._6_2_;
  auVar39._8_2_ = auVar38._8_2_ + auVar86._8_2_;
  auVar39._10_2_ = auVar38._10_2_ + auVar86._10_2_;
  auVar39._12_2_ = auVar38._12_2_ + auVar86._12_2_;
  auVar39._14_2_ = auVar38._14_2_ + auVar86._14_2_;
  auVar39 = pmulhw(auVar39,auVar108);
  auVar86._0_8_ = auVar20._8_8_;
  auVar86._8_4_ = auVar20._8_4_;
  auVar86._12_4_ = auVar20._12_4_;
  auVar38._8_4_ = auVar61._8_4_;
  auVar38._12_4_ = auVar61._12_4_;
  auVar38._0_8_ = auVar61._8_8_;
  auVar32._8_4_ = auVar108._8_4_;
  auVar32._12_4_ = auVar108._12_4_;
  auVar32._0_8_ = auVar108._8_8_;
  auVar108 = paddsw(auVar107,auVar86);
  auVar20 = pmulhw(auVar108,auVar38);
  auVar61._0_2_ = auVar20._0_2_ + auVar108._0_2_;
  auVar61._2_2_ = auVar20._2_2_ + auVar108._2_2_;
  auVar61._4_2_ = auVar20._4_2_ + auVar108._4_2_;
  auVar61._6_2_ = auVar20._6_2_ + auVar108._6_2_;
  auVar61._8_2_ = auVar20._8_2_ + auVar108._8_2_;
  auVar61._10_2_ = auVar20._10_2_ + auVar108._10_2_;
  auVar61._12_2_ = auVar20._12_2_ + auVar108._12_2_;
  auVar61._14_2_ = auVar20._14_2_ + auVar108._14_2_;
  auVar20 = pmulhw(auVar61,auVar32);
  auVar39 = auVar39 ^ auVar60;
  auVar40._0_2_ = auVar39._0_2_ - auVar60._0_2_;
  auVar40._2_2_ = auVar39._2_2_ - auVar60._2_2_;
  auVar40._4_2_ = auVar39._4_2_ - auVar60._4_2_;
  auVar40._6_2_ = auVar39._6_2_ - auVar60._6_2_;
  auVar40._8_2_ = auVar39._8_2_ - auVar60._8_2_;
  auVar40._10_2_ = auVar39._10_2_ - auVar60._10_2_;
  auVar40._12_2_ = auVar39._12_2_ - auVar60._12_2_;
  auVar40._14_2_ = auVar39._14_2_ - auVar60._14_2_;
  auVar20 = auVar20 ^ auVar87;
  auVar108._0_2_ = auVar20._0_2_ - auVar87._0_2_;
  auVar108._2_2_ = auVar20._2_2_ - auVar87._2_2_;
  auVar108._4_2_ = auVar20._4_2_ - auVar87._4_2_;
  auVar108._6_2_ = auVar20._6_2_ - auVar87._6_2_;
  auVar108._8_2_ = auVar20._8_2_ - auVar87._8_2_;
  auVar108._10_2_ = auVar20._10_2_ - auVar87._10_2_;
  auVar108._12_2_ = auVar20._12_2_ - auVar87._12_2_;
  auVar108._14_2_ = auVar20._14_2_ - auVar87._14_2_;
  auVar40 = auVar40 & auVar52;
  auVar108 = auVar108 & auVar54;
  auVar20 = psraw(auVar40,0xf);
  auVar90._0_12_ = auVar40._0_12_;
  auVar90._12_2_ = auVar40._6_2_;
  auVar90._14_2_ = auVar20._6_2_;
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._0_10_ = auVar40._0_10_;
  auVar89._10_2_ = auVar20._4_2_;
  auVar87._10_6_ = auVar89._10_6_;
  auVar87._0_8_ = auVar40._0_8_;
  auVar87._8_2_ = auVar40._4_2_;
  auVar88._8_8_ = auVar87._8_8_;
  auVar88._6_2_ = auVar20._2_2_;
  auVar88._4_2_ = auVar40._2_2_;
  auVar88._0_2_ = auVar40._0_2_;
  auVar88._2_2_ = auVar20._0_2_;
  *(undefined1 (*) [16])qcoeff_ptr = auVar88;
  *(short *)(qcoeff_ptr + 4) = auVar40._8_2_;
  *(short *)((long)qcoeff_ptr + 0x12) = auVar20._8_2_;
  *(short *)(qcoeff_ptr + 5) = auVar40._10_2_;
  *(short *)((long)qcoeff_ptr + 0x16) = auVar20._10_2_;
  *(short *)(qcoeff_ptr + 6) = auVar40._12_2_;
  *(short *)((long)qcoeff_ptr + 0x1a) = auVar20._12_2_;
  *(short *)(qcoeff_ptr + 7) = auVar40._14_2_;
  *(short *)((long)qcoeff_ptr + 0x1e) = auVar20._14_2_;
  auVar20 = psraw(auVar108,0xf);
  auVar94._0_12_ = auVar108._0_12_;
  auVar94._12_2_ = auVar108._6_2_;
  auVar94._14_2_ = auVar20._6_2_;
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._0_10_ = auVar108._0_10_;
  auVar93._10_2_ = auVar20._4_2_;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._0_8_ = auVar108._0_8_;
  auVar92._8_2_ = auVar108._4_2_;
  auVar91._8_8_ = auVar92._8_8_;
  auVar91._6_2_ = auVar20._2_2_;
  auVar91._4_2_ = auVar108._2_2_;
  auVar91._0_2_ = auVar108._0_2_;
  auVar91._2_2_ = auVar20._0_2_;
  *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar91;
  *(short *)(qcoeff_ptr + 0xc) = auVar108._8_2_;
  *(short *)((long)qcoeff_ptr + 0x32) = auVar20._8_2_;
  *(short *)(qcoeff_ptr + 0xd) = auVar108._10_2_;
  *(short *)((long)qcoeff_ptr + 0x36) = auVar20._10_2_;
  *(short *)(qcoeff_ptr + 0xe) = auVar108._12_2_;
  *(short *)((long)qcoeff_ptr + 0x3a) = auVar20._12_2_;
  *(short *)(qcoeff_ptr + 0xf) = auVar108._14_2_;
  *(short *)((long)qcoeff_ptr + 0x3e) = auVar20._14_2_;
  sVar33 = auVar88._0_2_ * sVar33;
  sVar44 = auVar40._2_2_ * sVar44;
  sVar45 = auVar40._4_2_ * sVar45;
  uVar34 = CONCAT24(sVar45,CONCAT22(sVar44,sVar33));
  sVar46 = auVar40._6_2_ * sVar46;
  uVar35 = CONCAT26(sVar46,uVar34);
  sVar47 = auVar40._8_2_ * sVar4;
  auVar36._0_10_ = CONCAT28(sVar47,uVar35);
  auVar36._10_2_ = auVar40._10_2_ * sVar5;
  auVar60._12_2_ = auVar40._12_2_ * sVar6;
  auVar60._0_12_ = auVar36;
  auVar60._14_2_ = auVar40._14_2_ * sVar7;
  sVar15 = auVar91._0_2_ * sVar4;
  sVar21 = auVar108._2_2_ * sVar5;
  sVar23 = auVar108._4_2_ * sVar6;
  uVar17 = CONCAT24(sVar23,CONCAT22(sVar21,sVar15));
  sVar25 = auVar108._6_2_ * sVar7;
  uVar18 = CONCAT26(sVar25,uVar17);
  sVar27 = auVar108._8_2_ * sVar4;
  auVar19._0_10_ = CONCAT28(sVar27,uVar18);
  auVar19._10_2_ = auVar108._10_2_ * sVar5;
  auVar20._12_2_ = auVar108._12_2_ * sVar6;
  auVar20._0_12_ = auVar19;
  auVar20._14_2_ = auVar108._14_2_ * sVar7;
  auVar61 = psraw(auVar60,0xf);
  auVar100._12_2_ = sVar46;
  auVar100._0_12_ = auVar36;
  auVar100._14_2_ = auVar61._6_2_;
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._10_2_ = auVar61._4_2_;
  auVar99._0_10_ = auVar36._0_10_;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = sVar45;
  auVar98._0_8_ = uVar35;
  auVar97._8_8_ = auVar98._8_8_;
  auVar97._6_2_ = auVar61._2_2_;
  auVar97._0_6_ = uVar34;
  auVar96._6_10_ = auVar97._6_10_;
  auVar96._4_2_ = sVar44;
  auVar96._0_4_ = CONCAT22(sVar44,sVar33);
  auVar95._4_12_ = auVar96._4_12_;
  auVar95._2_2_ = auVar61._0_2_;
  auVar95._0_2_ = sVar33;
  *(undefined1 (*) [16])dqcoeff_ptr = auVar95;
  *(short *)(dqcoeff_ptr + 4) = sVar47;
  *(short *)((long)dqcoeff_ptr + 0x12) = auVar61._8_2_;
  *(short *)(dqcoeff_ptr + 5) = auVar36._10_2_;
  *(short *)((long)dqcoeff_ptr + 0x16) = auVar61._10_2_;
  *(short *)(dqcoeff_ptr + 6) = auVar60._12_2_;
  *(short *)((long)dqcoeff_ptr + 0x1a) = auVar61._12_2_;
  *(short *)(dqcoeff_ptr + 7) = auVar60._14_2_;
  *(short *)((long)dqcoeff_ptr + 0x1e) = auVar61._14_2_;
  auVar61 = psraw(auVar20,0xf);
  auVar106._12_2_ = sVar25;
  auVar106._0_12_ = auVar19;
  auVar106._14_2_ = auVar61._6_2_;
  auVar105._12_4_ = auVar106._12_4_;
  auVar105._10_2_ = auVar61._4_2_;
  auVar105._0_10_ = auVar19._0_10_;
  auVar104._10_6_ = auVar105._10_6_;
  auVar104._8_2_ = sVar23;
  auVar104._0_8_ = uVar18;
  auVar103._8_8_ = auVar104._8_8_;
  auVar103._6_2_ = auVar61._2_2_;
  auVar103._0_6_ = uVar17;
  auVar102._6_10_ = auVar103._6_10_;
  auVar102._4_2_ = sVar21;
  auVar102._0_4_ = CONCAT22(sVar21,sVar15);
  auVar101._4_12_ = auVar102._4_12_;
  auVar101._2_2_ = auVar61._0_2_;
  auVar101._0_2_ = sVar15;
  *(undefined1 (*) [16])(dqcoeff_ptr + 8) = auVar101;
  *(short *)(dqcoeff_ptr + 0xc) = sVar27;
  *(short *)((long)dqcoeff_ptr + 0x32) = auVar61._8_2_;
  *(short *)(dqcoeff_ptr + 0xd) = auVar19._10_2_;
  *(short *)((long)dqcoeff_ptr + 0x36) = auVar61._10_2_;
  *(short *)(dqcoeff_ptr + 0xe) = auVar20._12_2_;
  *(short *)((long)dqcoeff_ptr + 0x3a) = auVar61._12_2_;
  *(short *)(dqcoeff_ptr + 0xf) = auVar20._14_2_;
  *(short *)((long)dqcoeff_ptr + 0x3e) = auVar61._14_2_;
  uVar57 = ~-(ushort)(sVar33 == 0) & *iscan_ptr + uVar16;
  uVar68 = ~-(ushort)(sVar44 == 0) & iscan_ptr[1] + uVar22;
  uVar71 = ~-(ushort)(sVar45 == 0) & iscan_ptr[2] + uVar24;
  uVar73 = ~-(ushort)(sVar46 == 0) & iscan_ptr[3] + uVar26;
  uVar76 = ~-(ushort)(sVar47 == 0) & iscan_ptr[4] + (ushort)(sVar11 < (short)auVar110._8_2_);
  uVar79 = ~-(ushort)(auVar36._10_2_ == 0) &
           iscan_ptr[5] + (ushort)(sVar12 < (short)auVar110._10_2_);
  uVar82 = ~-(ushort)(auVar60._12_2_ == 0) &
           iscan_ptr[6] + (ushort)(sVar13 < (short)auVar110._12_2_);
  uVar85 = ~-(ushort)(auVar60._14_2_ == 0) &
           iscan_ptr[7] + (ushort)(sVar14 < (short)auVar110._14_2_);
  uVar16 = ~-(ushort)(sVar15 == 0) & iscan_ptr[8] + (ushort)(sVar11 < (short)auVar107._0_2_);
  uVar22 = ~-(ushort)(sVar21 == 0) & iscan_ptr[9] + (ushort)(sVar12 < (short)auVar107._2_2_);
  uVar24 = ~-(ushort)(sVar23 == 0) & iscan_ptr[10] + (ushort)(sVar13 < (short)auVar107._4_2_);
  uVar26 = ~-(ushort)(sVar25 == 0) & iscan_ptr[0xb] + (ushort)(sVar14 < (short)auVar107._6_2_);
  uVar28 = ~-(ushort)(sVar27 == 0) & iscan_ptr[0xc] + (ushort)(sVar11 < (short)auVar107._8_2_);
  uVar29 = ~-(ushort)(auVar19._10_2_ == 0) &
           iscan_ptr[0xd] + (ushort)(sVar12 < (short)auVar107._10_2_);
  uVar30 = ~-(ushort)(auVar20._12_2_ == 0) &
           iscan_ptr[0xe] + (ushort)(sVar13 < (short)auVar107._12_2_);
  uVar31 = ~-(ushort)(auVar20._14_2_ == 0) &
           iscan_ptr[0xf] + (ushort)(sVar14 < (short)auVar107._14_2_);
  uVar16 = ((short)uVar16 < (short)uVar57) * uVar57 | ((short)uVar16 >= (short)uVar57) * uVar16;
  uVar22 = ((short)uVar22 < (short)uVar68) * uVar68 | ((short)uVar22 >= (short)uVar68) * uVar22;
  uVar24 = ((short)uVar24 < (short)uVar71) * uVar71 | ((short)uVar24 >= (short)uVar71) * uVar24;
  uVar26 = ((short)uVar26 < (short)uVar73) * uVar73 | ((short)uVar26 >= (short)uVar73) * uVar26;
  uVar28 = ((short)uVar28 < (short)uVar76) * uVar76 | ((short)uVar28 >= (short)uVar76) * uVar28;
  uVar29 = ((short)uVar29 < (short)uVar79) * uVar79 | ((short)uVar29 >= (short)uVar79) * uVar29;
  uVar30 = ((short)uVar30 < (short)uVar82) * uVar82 | ((short)uVar30 >= (short)uVar82) * uVar30;
  uVar31 = ((short)uVar31 < (short)uVar85) * uVar85 | ((short)uVar31 >= (short)uVar85) * uVar31;
  if (0x10 < n_coeffs) {
    lVar8 = 0x10;
    do {
      auVar20 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar8),
                         *(undefined1 (*) [16])(coeff_ptr + lVar8 + 4));
      auVar61 = packssdw(*(undefined1 (*) [16])(coeff_ptr + lVar8 + 8),
                         *(undefined1 (*) [16])(coeff_ptr + lVar8 + 0xc));
      sVar33 = auVar20._0_2_;
      sVar15 = -sVar33;
      sVar44 = auVar20._2_2_;
      sVar21 = -sVar44;
      sVar45 = auVar20._4_2_;
      sVar23 = -sVar45;
      sVar46 = auVar20._6_2_;
      sVar25 = -sVar46;
      sVar48 = auVar20._8_2_;
      sVar27 = -sVar48;
      sVar49 = auVar20._10_2_;
      sVar47 = -sVar49;
      sVar50 = auVar20._12_2_;
      sVar66 = -sVar50;
      sVar51 = auVar20._14_2_;
      sVar69 = -sVar51;
      auVar62._0_2_ = (ushort)(sVar15 < sVar33) * sVar33 | (ushort)(sVar15 >= sVar33) * sVar15;
      auVar62._2_2_ = (ushort)(sVar21 < sVar44) * sVar44 | (ushort)(sVar21 >= sVar44) * sVar21;
      auVar62._4_2_ = (ushort)(sVar23 < sVar45) * sVar45 | (ushort)(sVar23 >= sVar45) * sVar23;
      auVar62._6_2_ = (ushort)(sVar25 < sVar46) * sVar46 | (ushort)(sVar25 >= sVar46) * sVar25;
      auVar62._8_2_ = (ushort)(sVar27 < sVar48) * sVar48 | (ushort)(sVar27 >= sVar48) * sVar27;
      auVar62._10_2_ = (ushort)(sVar47 < sVar49) * sVar49 | (ushort)(sVar47 >= sVar49) * sVar47;
      auVar62._12_2_ = (ushort)(sVar66 < sVar50) * sVar50 | (ushort)(sVar66 >= sVar50) * sVar66;
      auVar62._14_2_ = (ushort)(sVar69 < sVar51) * sVar51 | (ushort)(sVar69 >= sVar51) * sVar69;
      auVar108 = psraw(auVar20,0xf);
      sVar33 = auVar61._0_2_;
      sVar15 = -sVar33;
      sVar44 = auVar61._2_2_;
      sVar21 = -sVar44;
      sVar45 = auVar61._4_2_;
      sVar23 = -sVar45;
      sVar46 = auVar61._6_2_;
      sVar25 = -sVar46;
      sVar48 = auVar61._8_2_;
      sVar27 = -sVar48;
      sVar49 = auVar61._10_2_;
      sVar47 = -sVar49;
      sVar50 = auVar61._12_2_;
      sVar66 = -sVar50;
      sVar51 = auVar61._14_2_;
      sVar69 = -sVar51;
      auVar109._0_2_ = (ushort)(sVar15 < sVar33) * sVar33 | (ushort)(sVar15 >= sVar33) * sVar15;
      auVar109._2_2_ = (ushort)(sVar21 < sVar44) * sVar44 | (ushort)(sVar21 >= sVar44) * sVar21;
      auVar109._4_2_ = (ushort)(sVar23 < sVar45) * sVar45 | (ushort)(sVar23 >= sVar45) * sVar23;
      auVar109._6_2_ = (ushort)(sVar25 < sVar46) * sVar46 | (ushort)(sVar25 >= sVar46) * sVar25;
      auVar109._8_2_ = (ushort)(sVar27 < sVar48) * sVar48 | (ushort)(sVar27 >= sVar48) * sVar27;
      auVar109._10_2_ = (ushort)(sVar47 < sVar49) * sVar49 | (ushort)(sVar47 >= sVar49) * sVar47;
      auVar109._12_2_ = (ushort)(sVar66 < sVar50) * sVar50 | (ushort)(sVar66 >= sVar50) * sVar66;
      auVar109._14_2_ = (ushort)(sVar69 < sVar51) * sVar51 | (ushort)(sVar69 >= sVar51) * sVar69;
      auVar39 = psraw(auVar61,0xf);
      auVar53._0_2_ = -(ushort)(sVar11 < (short)auVar62._0_2_);
      auVar53._2_2_ = -(ushort)(sVar12 < (short)auVar62._2_2_);
      auVar53._4_2_ = -(ushort)(sVar13 < (short)auVar62._4_2_);
      auVar53._6_2_ = -(ushort)(sVar14 < (short)auVar62._6_2_);
      auVar53._8_2_ = -(ushort)(sVar11 < (short)auVar62._8_2_);
      auVar53._10_2_ = -(ushort)(sVar12 < (short)auVar62._10_2_);
      auVar53._12_2_ = -(ushort)(sVar13 < (short)auVar62._12_2_);
      auVar53._14_2_ = -(ushort)(sVar14 < (short)auVar62._14_2_);
      auVar55._0_2_ = -(ushort)(sVar11 < (short)auVar109._0_2_);
      auVar55._2_2_ = -(ushort)(sVar12 < (short)auVar109._2_2_);
      auVar55._4_2_ = -(ushort)(sVar13 < (short)auVar109._4_2_);
      auVar55._6_2_ = -(ushort)(sVar14 < (short)auVar109._6_2_);
      auVar55._8_2_ = -(ushort)(sVar11 < (short)auVar109._8_2_);
      auVar55._10_2_ = -(ushort)(sVar12 < (short)auVar109._10_2_);
      auVar55._12_2_ = -(ushort)(sVar13 < (short)auVar109._12_2_);
      auVar55._14_2_ = -(ushort)(sVar14 < (short)auVar109._14_2_);
      auVar61 = paddsw(auVar62,auVar86);
      auVar20 = pmulhw(auVar61,auVar38);
      auVar41._0_2_ = auVar20._0_2_ + auVar61._0_2_;
      auVar41._2_2_ = auVar20._2_2_ + auVar61._2_2_;
      auVar41._4_2_ = auVar20._4_2_ + auVar61._4_2_;
      auVar41._6_2_ = auVar20._6_2_ + auVar61._6_2_;
      auVar41._8_2_ = auVar20._8_2_ + auVar61._8_2_;
      auVar41._10_2_ = auVar20._10_2_ + auVar61._10_2_;
      auVar41._12_2_ = auVar20._12_2_ + auVar61._12_2_;
      auVar41._14_2_ = auVar20._14_2_ + auVar61._14_2_;
      auVar20 = pmulhw(auVar41,auVar32);
      auVar110 = paddsw(auVar109,auVar86);
      auVar61 = pmulhw(auVar110,auVar38);
      auVar63._0_2_ = auVar61._0_2_ + auVar110._0_2_;
      auVar63._2_2_ = auVar61._2_2_ + auVar110._2_2_;
      auVar63._4_2_ = auVar61._4_2_ + auVar110._4_2_;
      auVar63._6_2_ = auVar61._6_2_ + auVar110._6_2_;
      auVar63._8_2_ = auVar61._8_2_ + auVar110._8_2_;
      auVar63._10_2_ = auVar61._10_2_ + auVar110._10_2_;
      auVar63._12_2_ = auVar61._12_2_ + auVar110._12_2_;
      auVar63._14_2_ = auVar61._14_2_ + auVar110._14_2_;
      auVar61 = pmulhw(auVar63,auVar32);
      auVar20 = auVar20 ^ auVar108;
      auVar42._0_2_ = auVar20._0_2_ - auVar108._0_2_;
      auVar42._2_2_ = auVar20._2_2_ - auVar108._2_2_;
      auVar42._4_2_ = auVar20._4_2_ - auVar108._4_2_;
      auVar42._6_2_ = auVar20._6_2_ - auVar108._6_2_;
      auVar42._8_2_ = auVar20._8_2_ - auVar108._8_2_;
      auVar42._10_2_ = auVar20._10_2_ - auVar108._10_2_;
      auVar42._12_2_ = auVar20._12_2_ - auVar108._12_2_;
      auVar42._14_2_ = auVar20._14_2_ - auVar108._14_2_;
      auVar61 = auVar61 ^ auVar39;
      auVar64._0_2_ = auVar61._0_2_ - auVar39._0_2_;
      auVar64._2_2_ = auVar61._2_2_ - auVar39._2_2_;
      auVar64._4_2_ = auVar61._4_2_ - auVar39._4_2_;
      auVar64._6_2_ = auVar61._6_2_ - auVar39._6_2_;
      auVar64._8_2_ = auVar61._8_2_ - auVar39._8_2_;
      auVar64._10_2_ = auVar61._10_2_ - auVar39._10_2_;
      auVar64._12_2_ = auVar61._12_2_ - auVar39._12_2_;
      auVar64._14_2_ = auVar61._14_2_ - auVar39._14_2_;
      auVar42 = auVar42 & auVar53;
      auVar64 = auVar64 & auVar55;
      auVar20 = psraw(auVar42,0xf);
      auVar114._0_12_ = auVar42._0_12_;
      auVar114._12_2_ = auVar42._6_2_;
      auVar114._14_2_ = auVar20._6_2_;
      auVar113._12_4_ = auVar114._12_4_;
      auVar113._0_10_ = auVar42._0_10_;
      auVar113._10_2_ = auVar20._4_2_;
      auVar112._10_6_ = auVar113._10_6_;
      auVar112._0_8_ = auVar42._0_8_;
      auVar112._8_2_ = auVar42._4_2_;
      auVar111._8_8_ = auVar112._8_8_;
      auVar111._6_2_ = auVar20._2_2_;
      auVar111._4_2_ = auVar42._2_2_;
      auVar111._0_2_ = auVar42._0_2_;
      auVar111._2_2_ = auVar20._0_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar8) = auVar111;
      ptVar2 = qcoeff_ptr + lVar8 + 4;
      *(short *)ptVar2 = auVar42._8_2_;
      *(short *)((long)ptVar2 + 2) = auVar20._8_2_;
      *(short *)(ptVar2 + 1) = auVar42._10_2_;
      *(short *)((long)ptVar2 + 6) = auVar20._10_2_;
      *(short *)(ptVar2 + 2) = auVar42._12_2_;
      *(short *)((long)ptVar2 + 10) = auVar20._12_2_;
      *(short *)(ptVar2 + 3) = auVar42._14_2_;
      *(short *)((long)ptVar2 + 0xe) = auVar20._14_2_;
      auVar20 = psraw(auVar64,0xf);
      auVar118._0_12_ = auVar64._0_12_;
      auVar118._12_2_ = auVar64._6_2_;
      auVar118._14_2_ = auVar20._6_2_;
      auVar117._12_4_ = auVar118._12_4_;
      auVar117._0_10_ = auVar64._0_10_;
      auVar117._10_2_ = auVar20._4_2_;
      auVar116._10_6_ = auVar117._10_6_;
      auVar116._0_8_ = auVar64._0_8_;
      auVar116._8_2_ = auVar64._4_2_;
      auVar115._8_8_ = auVar116._8_8_;
      auVar115._6_2_ = auVar20._2_2_;
      auVar115._4_2_ = auVar64._2_2_;
      auVar115._0_2_ = auVar64._0_2_;
      auVar115._2_2_ = auVar20._0_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + lVar8 + 8) = auVar115;
      ptVar2 = qcoeff_ptr + lVar8 + 0xc;
      *(short *)ptVar2 = auVar64._8_2_;
      *(short *)((long)ptVar2 + 2) = auVar20._8_2_;
      *(short *)(ptVar2 + 1) = auVar64._10_2_;
      *(short *)((long)ptVar2 + 6) = auVar20._10_2_;
      *(short *)(ptVar2 + 2) = auVar64._12_2_;
      *(short *)((long)ptVar2 + 10) = auVar20._12_2_;
      *(short *)(ptVar2 + 3) = auVar64._14_2_;
      *(short *)((long)ptVar2 + 0xe) = auVar20._14_2_;
      sVar15 = auVar111._0_2_ * sVar4;
      sVar21 = auVar42._2_2_ * sVar5;
      sVar23 = auVar42._4_2_ * sVar6;
      uVar17 = CONCAT24(sVar23,CONCAT22(sVar21,sVar15));
      sVar25 = auVar42._6_2_ * sVar7;
      uVar18 = CONCAT26(sVar25,uVar17);
      sVar27 = auVar42._8_2_ * sVar4;
      auVar37._0_10_ = CONCAT28(sVar27,uVar18);
      auVar37._10_2_ = auVar42._10_2_ * sVar5;
      auVar43._12_2_ = auVar42._12_2_ * sVar6;
      auVar43._0_12_ = auVar37;
      auVar43._14_2_ = auVar42._14_2_ * sVar7;
      sVar47 = auVar115._0_2_ * sVar4;
      sVar66 = auVar64._2_2_ * sVar5;
      sVar69 = auVar64._4_2_ * sVar6;
      uVar34 = CONCAT24(sVar69,CONCAT22(sVar66,sVar47));
      sVar33 = auVar64._6_2_ * sVar7;
      uVar35 = CONCAT26(sVar33,uVar34);
      sVar44 = auVar64._8_2_ * sVar4;
      auVar58._0_10_ = CONCAT28(sVar44,uVar35);
      auVar58._10_2_ = auVar64._10_2_ * sVar5;
      auVar65._12_2_ = auVar64._12_2_ * sVar6;
      auVar65._0_12_ = auVar58;
      auVar65._14_2_ = auVar64._14_2_ * sVar7;
      auVar20 = psraw(auVar43,0xf);
      auVar124._12_2_ = sVar25;
      auVar124._0_12_ = auVar37;
      auVar124._14_2_ = auVar20._6_2_;
      auVar123._12_4_ = auVar124._12_4_;
      auVar123._10_2_ = auVar20._4_2_;
      auVar123._0_10_ = auVar37._0_10_;
      auVar122._10_6_ = auVar123._10_6_;
      auVar122._8_2_ = sVar23;
      auVar122._0_8_ = uVar18;
      auVar121._8_8_ = auVar122._8_8_;
      auVar121._6_2_ = auVar20._2_2_;
      auVar121._0_6_ = uVar17;
      auVar120._6_10_ = auVar121._6_10_;
      auVar120._4_2_ = sVar21;
      auVar120._0_4_ = CONCAT22(sVar21,sVar15);
      auVar119._4_12_ = auVar120._4_12_;
      auVar119._2_2_ = auVar20._0_2_;
      auVar119._0_2_ = sVar15;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar8) = auVar119;
      ptVar2 = dqcoeff_ptr + lVar8 + 4;
      *(short *)ptVar2 = sVar27;
      *(short *)((long)ptVar2 + 2) = auVar20._8_2_;
      *(short *)(ptVar2 + 1) = auVar37._10_2_;
      *(short *)((long)ptVar2 + 6) = auVar20._10_2_;
      *(short *)(ptVar2 + 2) = auVar43._12_2_;
      *(short *)((long)ptVar2 + 10) = auVar20._12_2_;
      *(short *)(ptVar2 + 3) = auVar43._14_2_;
      *(short *)((long)ptVar2 + 0xe) = auVar20._14_2_;
      auVar20 = psraw(auVar65,0xf);
      auVar130._12_2_ = sVar33;
      auVar130._0_12_ = auVar58;
      auVar130._14_2_ = auVar20._6_2_;
      auVar129._12_4_ = auVar130._12_4_;
      auVar129._10_2_ = auVar20._4_2_;
      auVar129._0_10_ = auVar58._0_10_;
      auVar128._10_6_ = auVar129._10_6_;
      auVar128._8_2_ = sVar69;
      auVar128._0_8_ = uVar35;
      auVar127._8_8_ = auVar128._8_8_;
      auVar127._6_2_ = auVar20._2_2_;
      auVar127._0_6_ = uVar34;
      auVar126._6_10_ = auVar127._6_10_;
      auVar126._4_2_ = sVar66;
      auVar126._0_4_ = CONCAT22(sVar66,sVar47);
      auVar125._4_12_ = auVar126._4_12_;
      auVar125._2_2_ = auVar20._0_2_;
      auVar125._0_2_ = sVar47;
      *(undefined1 (*) [16])(dqcoeff_ptr + lVar8 + 8) = auVar125;
      ptVar2 = dqcoeff_ptr + lVar8 + 0xc;
      *(short *)ptVar2 = sVar44;
      *(short *)((long)ptVar2 + 2) = auVar20._8_2_;
      *(short *)(ptVar2 + 1) = auVar58._10_2_;
      *(short *)((long)ptVar2 + 6) = auVar20._10_2_;
      *(short *)(ptVar2 + 2) = auVar65._12_2_;
      *(short *)((long)ptVar2 + 10) = auVar20._12_2_;
      *(short *)(ptVar2 + 3) = auVar65._14_2_;
      *(short *)((long)ptVar2 + 0xe) = auVar20._14_2_;
      psVar1 = iscan_ptr + lVar8;
      psVar3 = iscan_ptr + lVar8 + 8;
      uVar57 = ~-(ushort)(sVar15 == 0) & *psVar1 + (ushort)(sVar11 < (short)auVar62._0_2_);
      uVar68 = ~-(ushort)(sVar21 == 0) & psVar1[1] + (ushort)(sVar12 < (short)auVar62._2_2_);
      uVar71 = ~-(ushort)(sVar23 == 0) & psVar1[2] + (ushort)(sVar13 < (short)auVar62._4_2_);
      uVar73 = ~-(ushort)(sVar25 == 0) & psVar1[3] + (ushort)(sVar14 < (short)auVar62._6_2_);
      uVar76 = ~-(ushort)(sVar27 == 0) & psVar1[4] + (ushort)(sVar11 < (short)auVar62._8_2_);
      uVar79 = ~-(ushort)(auVar37._10_2_ == 0) &
               psVar1[5] + (ushort)(sVar12 < (short)auVar62._10_2_);
      uVar82 = ~-(ushort)(auVar43._12_2_ == 0) &
               psVar1[6] + (ushort)(sVar13 < (short)auVar62._12_2_);
      uVar85 = ~-(ushort)(auVar43._14_2_ == 0) &
               psVar1[7] + (ushort)(sVar14 < (short)auVar62._14_2_);
      uVar56 = ~-(ushort)(sVar47 == 0) & *psVar3 + (ushort)(sVar11 < (short)auVar109._0_2_);
      uVar67 = ~-(ushort)(sVar66 == 0) & psVar3[1] + (ushort)(sVar12 < (short)auVar109._2_2_);
      uVar70 = ~-(ushort)(sVar69 == 0) & psVar3[2] + (ushort)(sVar13 < (short)auVar109._4_2_);
      uVar72 = ~-(ushort)(sVar33 == 0) & psVar3[3] + (ushort)(sVar14 < (short)auVar109._6_2_);
      uVar75 = ~-(ushort)(sVar44 == 0) & psVar3[4] + (ushort)(sVar11 < (short)auVar109._8_2_);
      uVar78 = ~-(ushort)(auVar58._10_2_ == 0) &
               psVar3[5] + (ushort)(sVar12 < (short)auVar109._10_2_);
      uVar81 = ~-(ushort)(auVar65._12_2_ == 0) &
               psVar3[6] + (ushort)(sVar13 < (short)auVar109._12_2_);
      uVar84 = ~-(ushort)(auVar65._14_2_ == 0) &
               psVar3[7] + (ushort)(sVar14 < (short)auVar109._14_2_);
      uVar57 = ((short)uVar56 < (short)uVar57) * uVar57 | ((short)uVar56 >= (short)uVar57) * uVar56;
      uVar68 = ((short)uVar67 < (short)uVar68) * uVar68 | ((short)uVar67 >= (short)uVar68) * uVar67;
      uVar71 = ((short)uVar70 < (short)uVar71) * uVar71 | ((short)uVar70 >= (short)uVar71) * uVar70;
      uVar73 = ((short)uVar72 < (short)uVar73) * uVar73 | ((short)uVar72 >= (short)uVar73) * uVar72;
      uVar76 = ((short)uVar75 < (short)uVar76) * uVar76 | ((short)uVar75 >= (short)uVar76) * uVar75;
      uVar79 = ((short)uVar78 < (short)uVar79) * uVar79 | ((short)uVar78 >= (short)uVar79) * uVar78;
      uVar82 = ((short)uVar81 < (short)uVar82) * uVar82 | ((short)uVar81 >= (short)uVar82) * uVar81;
      uVar85 = ((short)uVar84 < (short)uVar85) * uVar85 | ((short)uVar84 >= (short)uVar85) * uVar84;
      uVar16 = ((short)uVar16 < (short)uVar57) * uVar57 | ((short)uVar16 >= (short)uVar57) * uVar16;
      uVar22 = ((short)uVar22 < (short)uVar68) * uVar68 | ((short)uVar22 >= (short)uVar68) * uVar22;
      uVar24 = ((short)uVar24 < (short)uVar71) * uVar71 | ((short)uVar24 >= (short)uVar71) * uVar24;
      uVar26 = ((short)uVar26 < (short)uVar73) * uVar73 | ((short)uVar26 >= (short)uVar73) * uVar26;
      uVar28 = ((short)uVar28 < (short)uVar76) * uVar76 | ((short)uVar28 >= (short)uVar76) * uVar28;
      uVar29 = ((short)uVar29 < (short)uVar79) * uVar79 | ((short)uVar29 >= (short)uVar79) * uVar29;
      uVar30 = ((short)uVar30 < (short)uVar82) * uVar82 | ((short)uVar30 >= (short)uVar82) * uVar30;
      uVar31 = ((short)uVar31 < (short)uVar85) * uVar85 | ((short)uVar31 >= (short)uVar85) * uVar31;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 < n_coeffs);
  }
  auVar9._0_2_ = ((short)uVar28 < (short)uVar16) * uVar16 |
                 ((short)uVar28 >= (short)uVar16) * uVar28;
  auVar9._2_2_ = ((short)uVar29 < (short)uVar22) * uVar22 |
                 ((short)uVar29 >= (short)uVar22) * uVar29;
  auVar9._4_2_ = ((short)uVar30 < (short)uVar24) * uVar24 |
                 ((short)uVar30 >= (short)uVar24) * uVar30;
  auVar9._6_2_ = ((short)uVar31 < (short)uVar26) * uVar26 |
                 ((short)uVar31 >= (short)uVar26) * uVar31;
  auVar9._8_2_ = ((short)uVar16 < (short)uVar28) * uVar28 |
                 ((short)uVar16 >= (short)uVar28) * uVar16;
  auVar9._10_2_ =
       ((short)uVar22 < (short)uVar29) * uVar29 | ((short)uVar22 >= (short)uVar29) * uVar22;
  auVar9._12_2_ =
       ((short)uVar16 < (short)uVar30) * uVar30 | ((short)uVar16 >= (short)uVar30) * uVar16;
  auVar9._14_2_ =
       ((short)uVar22 < (short)uVar31) * uVar31 | ((short)uVar22 >= (short)uVar31) * uVar22;
  auVar20 = pshuflw(auVar59,auVar9,0xe);
  sVar15 = auVar20._0_2_;
  auVar10._0_2_ =
       (sVar15 < (short)auVar9._0_2_) * auVar9._0_2_ |
       (ushort)(sVar15 >= (short)auVar9._0_2_) * sVar15;
  sVar15 = auVar20._2_2_;
  auVar10._2_2_ =
       (sVar15 < (short)auVar9._2_2_) * auVar9._2_2_ |
       (ushort)(sVar15 >= (short)auVar9._2_2_) * sVar15;
  sVar15 = auVar20._4_2_;
  auVar10._4_2_ =
       (sVar15 < (short)auVar9._4_2_) * auVar9._4_2_ |
       (ushort)(sVar15 >= (short)auVar9._4_2_) * sVar15;
  sVar15 = auVar20._6_2_;
  auVar10._6_2_ =
       (sVar15 < (short)auVar9._6_2_) * auVar9._6_2_ |
       (ushort)(sVar15 >= (short)auVar9._6_2_) * sVar15;
  sVar15 = auVar20._8_2_;
  auVar10._8_2_ =
       (sVar15 < (short)auVar9._8_2_) * auVar9._8_2_ |
       (ushort)(sVar15 >= (short)auVar9._8_2_) * sVar15;
  sVar15 = auVar20._10_2_;
  auVar10._10_2_ =
       (sVar15 < (short)auVar9._10_2_) * auVar9._10_2_ |
       (ushort)(sVar15 >= (short)auVar9._10_2_) * sVar15;
  sVar15 = auVar20._12_2_;
  sVar21 = auVar20._14_2_;
  auVar10._12_2_ =
       (sVar15 < (short)auVar9._12_2_) * auVar9._12_2_ |
       (ushort)(sVar15 >= (short)auVar9._12_2_) * sVar15;
  auVar10._14_2_ =
       (sVar21 < (short)auVar9._14_2_) * auVar9._14_2_ |
       (ushort)(sVar21 >= (short)auVar9._14_2_) * sVar21;
  auVar20 = pshuflw(auVar9,auVar10,1);
  sVar15 = auVar20._2_2_;
  *eob_ptr = (sVar15 < (short)auVar10._2_2_) * auVar10._2_2_ |
             (ushort)(sVar15 >= (short)auVar10._2_2_) * sVar15;
  return;
}

Assistant:

void aom_quantize_b_sse2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                         const int16_t *zbin_ptr, const int16_t *round_ptr,
                         const int16_t *quant_ptr,
                         const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
                         tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr,
                         uint16_t *eob_ptr, const int16_t *scan_ptr,
                         const int16_t *iscan_ptr) {
  const __m128i zero = _mm_setzero_si128();
  int index = 16;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1;
  __m128i eob, eob0;

  (void)scan_ptr;

  // Setup global values.
  load_b_values(zbin_ptr, &zbin, round_ptr, &round, quant_ptr, &quant,
                dequant_ptr, &dequant, quant_shift_ptr, &shift);

  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  // Poor man's abs().
  coeff0_sign = _mm_srai_epi16(coeff0, 15);
  coeff1_sign = _mm_srai_epi16(coeff1, 15);
  qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

  calculate_qcoeff(&qcoeff0, round, quant, shift);

  round = _mm_unpackhi_epi64(round, round);
  quant = _mm_unpackhi_epi64(quant, quant);
  shift = _mm_unpackhi_epi64(shift, shift);

  calculate_qcoeff(&qcoeff1, round, quant, shift);

  // Reinsert signs
  qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
  qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

  // Mask out zbin threshold coeffs
  qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
  qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

  store_coefficients(qcoeff0, qcoeff_ptr);
  store_coefficients(qcoeff1, qcoeff_ptr + 8);

  coeff0 = calculate_dqcoeff(qcoeff0, dequant);
  dequant = _mm_unpackhi_epi64(dequant, dequant);
  coeff1 = calculate_dqcoeff(qcoeff1, dequant);

  store_coefficients(coeff0, dqcoeff_ptr);
  store_coefficients(coeff1, dqcoeff_ptr + 8);

  eob =
      scan_for_eob(&coeff0, &coeff1, cmp_mask0, cmp_mask1, iscan_ptr, 0, zero);

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    coeff0_sign = _mm_srai_epi16(coeff0, 15);
    coeff1_sign = _mm_srai_epi16(coeff1, 15);
    qcoeff0 = invert_sign_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(coeff1, coeff1_sign);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    calculate_qcoeff(&qcoeff0, round, quant, shift);
    calculate_qcoeff(&qcoeff1, round, quant, shift);

    qcoeff0 = invert_sign_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    coeff0 = calculate_dqcoeff(qcoeff0, dequant);
    coeff1 = calculate_dqcoeff(qcoeff1, dequant);

    store_coefficients(coeff0, dqcoeff_ptr + index);
    store_coefficients(coeff1, dqcoeff_ptr + index + 8);

    eob0 = scan_for_eob(&coeff0, &coeff1, cmp_mask0, cmp_mask1, iscan_ptr,
                        index, zero);
    eob = _mm_max_epi16(eob, eob0);

    index += 16;
  }

  *eob_ptr = accumulate_eob(eob);
}